

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_errors.h
# Opt level: O2

void __thiscall booster::locale::conv::conversion_error::conversion_error(conversion_error *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Conversion failed",&local_31);
  runtime_error::runtime_error(&this->super_runtime_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_00116ce8;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__conversion_error_00116d10;
  return;
}

Assistant:

conversion_error() : booster::runtime_error("Conversion failed") {}